

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O0

ASN1_OBJECT * OBJ_nid2obj(int n)

{
  ASN1_OBJECT *pAVar1;
  undefined1 local_50 [8];
  ASN1_OBJECT templ;
  ASN1_OBJECT *match;
  ASN1_OBJECT *obj;
  ASN1_OBJECT *pAStack_10;
  int nid_local;
  
  if (n == 0) {
    pAStack_10 = (ASN1_OBJECT *)OBJ_get_undef();
  }
  else {
    if ((n < 1) || (0x3c5 < n)) {
      CRYPTO_MUTEX_lock_read(&global_added_lock);
      if (global_added_by_nid != (lhash_st_ASN1_OBJECT *)0x0) {
        templ.ln._0_4_ = n;
        templ._32_8_ = lh_ASN1_OBJECT_retrieve(global_added_by_nid,(ASN1_OBJECT *)local_50);
        if ((ASN1_OBJECT *)templ._32_8_ != (ASN1_OBJECT *)0x0) {
          CRYPTO_MUTEX_unlock_read(&global_added_lock);
          return (ASN1_OBJECT *)templ._32_8_;
        }
        templ.flags = 0;
        templ._36_4_ = 0;
      }
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
    }
    else {
      pAVar1 = (ASN1_OBJECT *)get_builtin_object(n);
      if (n == 0) {
        return pAVar1;
      }
      if (pAVar1->nid != 0) {
        return pAVar1;
      }
    }
    ERR_put_error(8,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/obj/obj.cc"
                  ,0x143);
    pAStack_10 = (ASN1_OBJECT *)0x0;
  }
  return pAStack_10;
}

Assistant:

ASN1_OBJECT *OBJ_nid2obj(int nid) {
  if (nid == NID_undef) {
    return (ASN1_OBJECT *)OBJ_get_undef();
  }

  if (nid > 0 && nid < NUM_NID) {
    const ASN1_OBJECT *obj = get_builtin_object(nid);
    if (nid != NID_undef && obj->nid == NID_undef) {
      goto err;
    }
    return (ASN1_OBJECT *)obj;
  }

  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if (global_added_by_nid != NULL) {
    ASN1_OBJECT *match, templ;

    templ.nid = nid;
    match = lh_ASN1_OBJECT_retrieve(global_added_by_nid, &templ);
    if (match != NULL) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      return match;
    }
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);

err:
  OPENSSL_PUT_ERROR(OBJ, OBJ_R_UNKNOWN_NID);
  return NULL;
}